

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

Vec_Int_t * Cnf_ManWriteCnfMapping(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  Vec_Int_t *p_00;
  int *__s;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar4 = p->pManAig->vObjs->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = __s;
  p_00->nSize = iVar4;
  memset(__s,0,(long)iVar4 << 2);
  if (0 < vMapped->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = vMapped->pArray[lVar7];
      if ((*(uint *)((long)pvVar2 + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfWrite.c"
                      ,0x37,"Vec_Int_t *Cnf_ManWriteCnfMapping(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      pcVar3 = *(char **)((long)pvVar2 + 0x28);
      cVar1 = *pcVar3;
      if (4 < (long)cVar1) {
        __assert_fail("pCut->nFanins < 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfWrite.c"
                      ,0x39,"Vec_Int_t *Cnf_ManWriteCnfMapping(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      iVar5 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar5 < 0) || (p_00->nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p_00->pArray[iVar5] = iVar4;
      Vec_IntPush(p_00,*(int *)(pcVar3 + (long)cVar1 * 4 + 0x18));
      if (*pcVar3 < '\x01') {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        do {
          Vec_IntPush(p_00,*(int *)(pcVar3 + lVar6 * 4 + 0x18));
          lVar6 = lVar6 + 1;
        } while (lVar6 < *pcVar3);
      }
      if ((uint)lVar6 < 4) {
        iVar5 = (uint)lVar6 - 4;
        do {
          Vec_IntPush(p_00,-1);
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0);
      }
      iVar4 = iVar4 + 5;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMapped->nSize);
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives CNF mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Cnf_ManWriteCnfMapping( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Vec_Int_t * vResult;
    Aig_Obj_t * pObj;
    Cnf_Cut_t * pCut;
    int i, k, nOffset;
    nOffset = Aig_ManObjNumMax(p->pManAig);
    vResult = Vec_IntStart( nOffset );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        assert( pCut->nFanins < 5 );
        Vec_IntWriteEntry( vResult, Aig_ObjId(pObj), nOffset );
        Vec_IntPush( vResult, *Cnf_CutTruth(pCut) );
        for ( k = 0; k < pCut->nFanins; k++ )
            Vec_IntPush( vResult, pCut->pFanins[k] );
        for (      ; k < 4; k++ )
            Vec_IntPush( vResult, -1 );
        nOffset += 5;
    }
    return vResult;
}